

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtyperevision.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QTypeRevision *revision)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  _func_int **pp_Var4;
  byte bVar5;
  QDebug *this;
  QTypeRevision *pQVar6;
  byte *in_RDX;
  char *t;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)revision);
  bVar1 = in_RDX[1];
  bVar5 = *in_RDX;
  if (bVar1 == 0xff) {
    pQVar6 = revision;
    if (bVar5 == 0xff) {
      *(undefined1 *)(*(long *)revision + 0x31) = 1;
      t = "invalid";
      goto LAB_0034c888;
    }
  }
  else {
    lVar3 = *(long *)revision;
    *(undefined1 *)(lVar3 + 0x30) = 0;
    if (bVar5 == 0xff) {
      *(undefined1 *)(lVar3 + 0x31) = 1;
      pQVar6 = (QTypeRevision *)QDebug::operator<<((QDebug *)revision,(uint)bVar1);
      t = ".x";
LAB_0034c888:
      QDebug::operator<<((QDebug *)pQVar6,t);
      goto LAB_0034c88d;
    }
    this = QDebug::operator<<((QDebug *)revision,(uint)bVar1);
    pQVar6 = (QTypeRevision *)QDebug::operator<<(this,'.');
    bVar5 = *in_RDX;
  }
  QDebug::operator<<((QDebug *)pQVar6,(uint)bVar5);
LAB_0034c88d:
  pp_Var4 = *(_func_int ***)revision;
  *(undefined8 *)revision = 0;
  ((debug.stream)->ts)._vptr_QTextStream = pp_Var4;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QTypeRevision &revision)
{
    QDebugStateSaver saver(debug);
    if (revision.hasMajorVersion()) {
        if (revision.hasMinorVersion())
            debug.nospace() << revision.majorVersion() << '.' << revision.minorVersion();
        else
            debug.nospace().noquote() << revision.majorVersion() << ".x";
    } else {
        if (revision.hasMinorVersion())
            debug << revision.minorVersion();
        else
            debug.noquote() << "invalid";
    }
    return debug;
}